

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Animator_Abort_Do_proc(Am_Object *interp)

{
  Am_Value *in_value;
  undefined1 in_CL;
  Am_Value value;
  Am_Value local_40;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  
  Am_Object::Am_Object(&local_28,interp);
  Am_Stop_Timer(&local_28,0xe8);
  Am_Object::~Am_Object(&local_28);
  Am_Object::Am_Object(&local_30,interp);
  Am_Set_Animated_Slots(&local_30);
  Am_Object::~Am_Object(&local_30);
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  in_value = Am_Object::Get(interp,0xc5,1);
  Am_Value::operator=(&local_40,in_value);
  Am_Value::Am_Value(&local_20,&local_40);
  call_all_commands(&local_20,0xc9,interp,(bool)in_CL);
  Am_Value::~Am_Value(&local_20);
  Am_Value::~Am_Value(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Abort_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Animator Abort of " << interp);

  // leave current value as-is, but stop the timer
  Am_Stop_Timer(interp, Am_ANIMATION_METHOD);

  Am_Set_Animated_Slots(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_ABORT_DO_METHOD, interp, false);
}